

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testProcess.c
# Opt level: O0

void test6(int argc,char **argv)

{
  undefined1 local_2028 [8];
  char runaway [8193];
  int local_1c;
  int i;
  char **argv_local;
  int argc_local;
  
  for (local_1c = 0; local_1c < 0x2000; local_1c = local_1c + 1) {
    local_2028[local_1c] = 0x2e;
  }
  runaway[0x1ff8] = '\n';
  do {
    fwrite(local_2028,1,0x2001,_stdout);
    fflush(_stdout);
  } while( true );
}

Assistant:

static void test6(int argc, const char* argv[])
{
  int i;
  char runaway[TEST6_SIZE + 1];
  (void)argc;
  (void)argv;
  for (i = 0; i < TEST6_SIZE; ++i) {
    runaway[i] = '.';
  }
  runaway[TEST6_SIZE] = '\n';

  /* Generate huge amounts of output to test killing.  */
  for (;;) {
    fwrite(runaway, 1, TEST6_SIZE + 1, stdout);
    fflush(stdout);
  }
}